

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O2

void load_psw(CPUS390XState_conflict *env,uint64_t mask,uint64_t addr)

{
  ulong uVar1;
  
  (env->psw).addr = addr;
  uVar1 = (env->psw).mask;
  (env->psw).mask = mask;
  env->cc_op = (uint)(mask >> 0x2c) & 3;
  if (((uVar1 ^ mask) >> 0x3e & 1) == 0) {
    return;
  }
  s390_cpu_recompute_watchpoints((CPUState *)(env[-0x1e].vregs + 0xf));
  return;
}

Assistant:

void load_psw(CPUS390XState *env, uint64_t mask, uint64_t addr)
{
    uint64_t old_mask = env->psw.mask;

    env->psw.addr = addr;
    env->psw.mask = mask;

    env->cc_op = (mask >> 44) & 3;

    if ((old_mask ^ mask) & PSW_MASK_PER) {
        s390_cpu_recompute_watchpoints(env_cpu(env));
    }

    if (mask & PSW_MASK_WAIT) {
        s390_handle_wait(env_archcpu(env));
    }
}